

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O2

int __thiscall
QMimeBinaryProvider::matchGlobList
          (QMimeBinaryProvider *this,QMimeGlobMatchResult *result,CacheFile *cacheFile,int off,
          QString *fileName)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QMimeGlobPattern glob;
  QArrayDataPointer<char16_t> local_d8;
  QLatin1String local_b8;
  QLatin1StringView local_a8;
  QArrayDataPointer<char16_t> local_98;
  undefined1 local_78 [56];
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = *(uint *)(cacheFile->data + off);
  uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  iVar4 = 0;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  uVar7 = (ulong)uVar6;
  lVar5 = (long)off;
  while( true ) {
    bVar8 = uVar7 == 0;
    uVar7 = uVar7 - 1;
    if (bVar8) break;
    puVar3 = cacheFile->data;
    uVar6 = *(uint *)(puVar3 + lVar5 + 4);
    uVar1 = *(uint *)(puVar3 + lVar5 + 8);
    uVar2 = *(uint *)(puVar3 + lVar5 + 0xc);
    local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QLatin1String::QLatin1String
              (&local_a8,
               (char *)(puVar3 + (int)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 |
                                       (uVar6 & 0xff00) << 8 | uVar6 << 0x18)));
    QString::QString((QString *)&local_98,local_a8);
    local_b8.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.m_data = &DAT_aaaaaaaaaaaaaaaa;
    QLatin1String::QLatin1String
              (&local_b8,
               (char *)(cacheFile->data +
                       (int)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                            uVar1 << 0x18)));
    latin1.m_data = local_b8.m_data;
    latin1.m_size = local_b8.m_size;
    QString::QString((QString *)local_78,latin1);
    bVar8 = QMimeProviderBase::isMimeTypeGlobsExcluded
                      (&this->super_QMimeProviderBase,(QString *)local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_78);
    if (!bVar8) {
      uVar6 = uVar2 >> 0x18;
      local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_d8.d = (Data *)0x0;
      local_d8.ptr = (char16_t *)0x0;
      local_d8.size = 0;
      QMimeGlobPattern::QMimeGlobPattern
                ((QMimeGlobPattern *)local_78,(QString *)&local_98,(QString *)&local_d8,uVar6,
                 ((uVar2 & 0xff0000) >> 8 & 0x100) >> 8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      bVar8 = QMimeGlobPattern::matchFileName((QMimeGlobPattern *)local_78,fileName);
      if (bVar8) {
        latin1_00.m_data = local_b8.m_data;
        latin1_00.m_size = local_b8.m_size;
        QString::QString((QString *)&local_d8,latin1_00);
        QMimeGlobMatchResult::addMatch(result,(QString *)&local_d8,uVar6,(QString *)&local_98,0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
        iVar4 = iVar4 + 1;
      }
      QMimeGlobPattern::~QMimeGlobPattern((QMimeGlobPattern *)local_78);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    lVar5 = lVar5 + 0xc;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int QMimeBinaryProvider::matchGlobList(QMimeGlobMatchResult &result, CacheFile *cacheFile, int off,
                                       const QString &fileName)
{
    int numMatches = 0;
    const int numGlobs = cacheFile->getUint32(off);
    //qDebug() << "Loading" << numGlobs << "globs from" << cacheFile->file.fileName() << "at offset" << cacheFile->globListOffset;
    for (int i = 0; i < numGlobs; ++i) {
        const int globOffset = cacheFile->getUint32(off + 4 + 12 * i);
        const int mimeTypeOffset = cacheFile->getUint32(off + 4 + 12 * i + 4);
        const int flagsAndWeight = cacheFile->getUint32(off + 4 + 12 * i + 8);
        const int weight = flagsAndWeight & 0xff;
        const bool caseSensitive = flagsAndWeight & 0x100;
        const Qt::CaseSensitivity qtCaseSensitive = caseSensitive ? Qt::CaseSensitive : Qt::CaseInsensitive;
        const QString pattern = QLatin1StringView(cacheFile->getCharStar(globOffset));

        const QLatin1StringView mimeType(cacheFile->getCharStar(mimeTypeOffset));
        //qDebug() << pattern << mimeType << weight << caseSensitive;
        if (isMimeTypeGlobsExcluded(mimeType))
            continue;

        QMimeGlobPattern glob(pattern, QString() /*unused*/, weight, qtCaseSensitive);
        if (glob.matchFileName(fileName)) {
            result.addMatch(mimeType, weight, pattern);
            ++numMatches;
        }
    }
    return numMatches;
}